

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,Hex *args_1)

{
  Printer *this_00;
  undefined8 uVar1;
  undefined4 uVar2;
  long lVar3;
  Hex hex;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_b8;
  string local_a0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  AlphaNum local_60;
  
  this_00 = this->printer_;
  ToString<int,void>(&local_a0,(Formatter *)(ulong)(uint)*args,(int)args);
  uVar1 = args_1->value;
  uVar2 = args_1->spec;
  hex.spec = uVar2;
  hex.value = uVar1;
  hex._12_4_ = 0;
  strings::AlphaNum::AlphaNum(&local_60,hex);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,local_60.piece_data_,local_60.piece_data_ + local_60.piece_size_);
  __l._M_len = 2;
  __l._M_array = &local_a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_b8,__l,(allocator_type *)&local_60);
  io::Printer::FormatInternal(this_00,&vStack_b8,&this->vars_,format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_b8);
  lVar3 = 0;
  do {
    if (local_70 + lVar3 != *(undefined1 **)((long)local_80 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_80 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }